

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  int number;
  ulong uVar1;
  long *plVar2;
  bool bVar3;
  CppType CVar4;
  Type TVar5;
  uint32_t uVar6;
  undefined8 *puVar7;
  OneofDescriptor *oneof_descriptor;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar4 = FieldDescriptor::cpp_type(field);
  if (CVar4 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  this_00 = &this->schema_;
  if (((byte)field[1] & 8) != 0) {
    uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    number = *(int *)(field + 4);
    TVar5 = FieldDescriptor::type(field);
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),number,
               (FieldType)TVar5,field,&sub_message->super_MessageLite);
    return;
  }
  bVar3 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar3) {
    if (((byte)field[1] & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
    }
    ClearOneof(this,message,oneof_descriptor);
    if (sub_message != (Message *)0x0) {
      uVar6 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
      *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
           sub_message;
      SetOneofCase(this,message,field);
      return;
    }
  }
  else {
    if (sub_message == (Message *)0x0) {
      ClearBit(this,message,field);
    }
    else {
      SetBit(this,message,field);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
    puVar7 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar7 = (undefined8 *)*puVar7;
    }
    if ((puVar7 == (undefined8 *)0x0) &&
       (plVar2 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
       plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 8))();
    }
    *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
         sub_message;
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);


  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (message->GetArenaForAllocation() == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}